

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Rendering.cpp
# Opt level: O3

void __thiscall Assimp::X3DImporter::ParseNode_Rendering_IndexedTriangleSet(X3DImporter *this)

{
  int *__args;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  FIReader *pFVar2;
  char *pcVar3;
  _func_int **pp_Var4;
  _func_int **pp_Var5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  undefined4 extraout_var;
  char *__s;
  undefined4 extraout_var_01;
  _List_node_base *p_Var9;
  CX3DImporter_NodeElement *pNode;
  pointer piVar10;
  runtime_error *this_00;
  ulong uVar11;
  int *piVar12;
  CX3DImporter_NodeElement *pCVar13;
  string *psVar14;
  X3DImporter *this_01;
  iterator iVar15;
  char *__end;
  pointer piVar16;
  int pAttrIdx;
  size_t *psVar17;
  string an;
  int32_t idx [3];
  vector<int,_std::allocator<int>_> index;
  CX3DImporter_NodeElement *ne;
  string def;
  string use;
  bool local_d4;
  bool local_d3;
  bool local_d2;
  bool local_d1;
  string local_d0;
  X3DImporter *local_b0;
  int local_a4 [3];
  vector<int,_std::allocator<int>_> local_98;
  CX3DImporter_NodeElement *local_78;
  string local_70;
  string local_50;
  undefined4 extraout_var_00;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_78 = (CX3DImporter_NodeElement *)0x0;
  uVar7 = (*(((this->mReader)._M_t.
              super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
              super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
              super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
            super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[4])();
  local_b0 = this;
  if ((int)uVar7 < 1) {
    local_d2 = true;
    local_d3 = true;
    local_d1 = true;
    local_d4 = true;
  }
  else {
    uVar11 = 0;
    local_d4 = true;
    local_d1 = true;
    local_d3 = true;
    local_d2 = true;
    do {
      pFVar2 = (this->mReader)._M_t.
               super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
               super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
               super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
      pAttrIdx = (int)uVar11;
      iVar8 = (*(pFVar2->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                        (pFVar2,uVar11);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d0,(char *)CONCAT44(extraout_var,iVar8),
                 (allocator<char> *)local_a4);
      iVar8 = std::__cxx11::string::compare((char *)&local_d0);
      if (iVar8 == 0) {
        iVar8 = (*(((this->mReader)._M_t.
                    super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                    .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                  super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
        __s = (char *)CONCAT44(extraout_var_00,iVar8);
        psVar14 = &local_70;
LAB_0070ee02:
        pcVar3 = (char *)psVar14->_M_string_length;
        strlen(__s);
        std::__cxx11::string::_M_replace((ulong)psVar14,0,pcVar3,(ulong)__s);
        this = local_b0;
      }
      else {
        iVar8 = std::__cxx11::string::compare((char *)&local_d0);
        if (iVar8 == 0) {
          iVar8 = (*(((this->mReader)._M_t.
                      super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                      .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                    super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
          __s = (char *)CONCAT44(extraout_var_01,iVar8);
          psVar14 = &local_50;
          goto LAB_0070ee02;
        }
        iVar8 = std::__cxx11::string::compare((char *)&local_d0);
        if (((iVar8 != 0) && (iVar8 = std::__cxx11::string::compare((char *)&local_d0), iVar8 != 0))
           && (iVar8 = std::__cxx11::string::compare((char *)&local_d0), iVar8 != 0)) {
          iVar8 = std::__cxx11::string::compare((char *)&local_d0);
          if (iVar8 == 0) {
            local_d4 = XML_ReadNode_GetAttrVal_AsBool(this,pAttrIdx);
          }
          else {
            iVar8 = std::__cxx11::string::compare((char *)&local_d0);
            if (iVar8 == 0) {
              local_d1 = XML_ReadNode_GetAttrVal_AsBool(this,pAttrIdx);
            }
            else {
              iVar8 = std::__cxx11::string::compare((char *)&local_d0);
              if (iVar8 == 0) {
                XML_ReadNode_GetAttrVal_AsArrI32(this,pAttrIdx,&local_98);
              }
              else {
                iVar8 = std::__cxx11::string::compare((char *)&local_d0);
                if (iVar8 == 0) {
                  local_d2 = XML_ReadNode_GetAttrVal_AsBool(this,pAttrIdx);
                }
                else {
                  iVar8 = std::__cxx11::string::compare((char *)&local_d0);
                  if (iVar8 == 0) {
                    local_d3 = XML_ReadNode_GetAttrVal_AsBool(this,pAttrIdx);
                  }
                  else {
                    Throw_IncorrectAttr(this,&local_d0);
                  }
                }
              }
            }
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      uVar11 = (ulong)(pAttrIdx + 1U);
    } while (uVar7 != pAttrIdx + 1U);
  }
  if (local_50._M_string_length == 0) {
    if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d0,
                 "IndexedTriangleSet must contain not empty \"index\" attribute.","");
      std::runtime_error::runtime_error(this_00,(string *)&local_d0);
      *(undefined ***)this_00 = &PTR__runtime_error_008bf448;
      __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    pNode = (CX3DImporter_NodeElement *)operator_new(0xf0);
    pCVar13 = this->NodeElement_Cur;
    pNode->Type = ENET_IndexedTriangleSet;
    (pNode->ID)._M_dataplus._M_p = (pointer)&(pNode->ID).field_2;
    (pNode->ID)._M_string_length = 0;
    (pNode->ID).field_2._M_local_buf[0] = '\0';
    pNode->Parent = pCVar13;
    (pNode->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&pNode->Child;
    (pNode->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&pNode->Child;
    (pNode->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node._M_size = 0;
    *(CX3DImporter_NodeElement **)&pNode[1].Type = pNode + 1;
    pNode[1]._vptr_CX3DImporter_NodeElement = (_func_int **)(pNode + 1);
    pNode[1].ID._M_dataplus._M_p = (pointer)0x0;
    pNode[1].ID._M_string_length = 0;
    pNode[1].ID.field_2._M_local_buf[0] = '\x01';
    pNode->_vptr_CX3DImporter_NodeElement =
         (_func_int **)&PTR__CX3DImporter_NodeElement_IndexedSet_009968b8;
    *(undefined8 *)((long)&pNode[1].ID.field_2 + 8) = 0;
    pNode[1].Parent = (CX3DImporter_NodeElement *)0x0;
    pNode[1].Child.
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
    pNode[1].Child.
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node._M_size = 0;
    pNode[2]._vptr_CX3DImporter_NodeElement = (_func_int **)0x0;
    *(undefined8 *)&pNode[2].Type = 0;
    pNode[2].ID._M_string_length = 0;
    pNode[2].ID.field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&pNode[2].ID.field_2 + 8) = 0;
    pNode[2].Child.
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node._M_size = 0;
    pNode[2].Child.
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
    pNode[2].Child.
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
    local_78 = pNode;
    if (local_70._M_string_length == 0) {
      pNode[1].ID.field_2._M_local_buf[1] = local_d4;
      *(bool *)&pNode[1].Child.
                super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                ._M_impl._M_node.super__List_node_base._M_prev = local_d1;
      *(bool *)&pNode[2].Parent = local_d2;
      pNode[1].ID.field_2._M_local_buf[0] = local_d3;
    }
    else {
      std::__cxx11::string::_M_assign((string *)&pNode->ID);
      pp_Var4 = (_func_int **)
                pNode[1].Child.
                super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                ._M_impl._M_node._M_size;
      pp_Var5 = pNode[2]._vptr_CX3DImporter_NodeElement;
      pNode[1].ID.field_2._M_local_buf[1] = local_d4;
      *(bool *)&pNode[1].Child.
                super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                ._M_impl._M_node.super__List_node_base._M_prev = local_d1;
      *(bool *)&pNode[2].Parent = local_d2;
      pNode[1].ID.field_2._M_local_buf[0] = local_d3;
      if (pp_Var5 != pp_Var4) {
        pNode[2]._vptr_CX3DImporter_NodeElement = pp_Var4;
      }
    }
    pCVar13 = pNode + 2;
    if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      psVar17 = &pNode[1].Child.
                 super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                 ._M_impl._M_node._M_size;
      uVar11 = 0;
      __args = local_a4 + 1;
      piVar10 = local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
      piVar16 = local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        local_a4[uVar11] = *piVar16;
        if ((int)uVar11 < 2) {
          uVar11 = (ulong)((int)uVar11 + 1);
        }
        else {
          iVar15._M_current = (int *)pNode[2]._vptr_CX3DImporter_NodeElement;
          if (local_d4 == false) {
            if (iVar15._M_current == *(int **)&pNode[2].Type) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)psVar17,iVar15,local_a4);
              iVar15._M_current = (int *)pCVar13->_vptr_CX3DImporter_NodeElement;
            }
            else {
              *iVar15._M_current = local_a4[0];
              iVar15._M_current = (int *)((long)pCVar13->_vptr_CX3DImporter_NodeElement + 4);
              pCVar13->_vptr_CX3DImporter_NodeElement = (_func_int **)iVar15._M_current;
            }
            piVar12 = __args;
            if (iVar15._M_current == *(int **)&pNode[2].Type) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)psVar17,iVar15,local_a4 + 2);
              iVar15._M_current = (int *)pCVar13->_vptr_CX3DImporter_NodeElement;
            }
            else {
              *iVar15._M_current = local_a4[2];
              iVar15._M_current = (int *)((long)pCVar13->_vptr_CX3DImporter_NodeElement + 4);
              pCVar13->_vptr_CX3DImporter_NodeElement = (_func_int **)iVar15._M_current;
            }
          }
          else {
            if (iVar15._M_current == *(int **)&pNode[2].Type) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)psVar17,iVar15,local_a4);
              iVar15._M_current = (int *)pCVar13->_vptr_CX3DImporter_NodeElement;
            }
            else {
              *iVar15._M_current = local_a4[0];
              iVar15._M_current = (int *)((long)pCVar13->_vptr_CX3DImporter_NodeElement + 4);
              pCVar13->_vptr_CX3DImporter_NodeElement = (_func_int **)iVar15._M_current;
            }
            if (iVar15._M_current == *(int **)&pNode[2].Type) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)psVar17,iVar15,__args);
              iVar15._M_current = (int *)pCVar13->_vptr_CX3DImporter_NodeElement;
            }
            else {
              *iVar15._M_current = local_a4[1];
              iVar15._M_current = (int *)((long)pCVar13->_vptr_CX3DImporter_NodeElement + 4);
              pCVar13->_vptr_CX3DImporter_NodeElement = (_func_int **)iVar15._M_current;
            }
            piVar12 = local_a4 + 2;
          }
          if (iVar15._M_current == *(int **)&pNode[2].Type) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)psVar17,iVar15,piVar12);
          }
          else {
            *iVar15._M_current = *piVar12;
            pCVar13->_vptr_CX3DImporter_NodeElement =
                 (_func_int **)((long)pCVar13->_vptr_CX3DImporter_NodeElement + 4);
          }
          local_d0._M_dataplus._M_p._0_4_ = 0xffffffff;
          std::vector<int,_std::allocator<int>_>::emplace_back<int>
                    ((vector<int,_std::allocator<int>_> *)psVar17,(int *)&local_d0);
          uVar11 = 0;
          piVar10 = local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        }
        piVar16 = piVar16 + 1;
      } while (piVar16 != piVar10);
    }
    this_01 = local_b0;
    iVar8 = (*(((local_b0->mReader)._M_t.
                super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t
                .super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
                super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
              super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xf])();
    if ((char)iVar8 == '\0') {
      ParseHelper_Node_Enter(this_01,pNode);
      paVar1 = &local_d0.field_2;
      do {
        do {
          while( true ) {
            iVar8 = (*(((this_01->mReader)._M_t.
                        super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                        .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                      super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[2])();
            if ((char)iVar8 == '\0') {
              local_d0._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_d0,"IndexedTriangleSet","");
              Throw_CloseNotFound(this_01,&local_d0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d0._M_dataplus._M_p != paVar1) {
                operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1
                               );
              }
              goto LAB_0070f561;
            }
            iVar8 = (*(((this_01->mReader)._M_t.
                        super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                        .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                      super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[3])();
            if (iVar8 != 1) break;
            local_d0._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Color","");
            (*(((this_01->mReader)._M_t.
                super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t
                .super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
                super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
              super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
            iVar8 = std::__cxx11::string::compare((char *)&local_d0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != paVar1) {
              operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
            }
            this_01 = local_b0;
            if (iVar8 == 0) {
              ParseNode_Rendering_Color(local_b0);
            }
            else {
              local_d0._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"ColorRGBA","");
              (*(((local_b0->mReader)._M_t.
                  super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                  .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
              iVar8 = std::__cxx11::string::compare((char *)&local_d0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d0._M_dataplus._M_p != paVar1) {
                operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1
                               );
              }
              this_01 = local_b0;
              if (iVar8 == 0) {
                ParseNode_Rendering_ColorRGBA(local_b0);
              }
              else {
                local_d0._M_dataplus._M_p = (pointer)paVar1;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Coordinate","")
                ;
                (*(((local_b0->mReader)._M_t.
                    super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                    .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                  super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
                iVar8 = std::__cxx11::string::compare((char *)&local_d0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_d0._M_dataplus._M_p != paVar1) {
                  operator_delete(local_d0._M_dataplus._M_p,
                                  local_d0.field_2._M_allocated_capacity + 1);
                }
                this_01 = local_b0;
                if (iVar8 == 0) {
                  ParseNode_Rendering_Coordinate(local_b0);
                }
                else {
                  local_d0._M_dataplus._M_p = (pointer)paVar1;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Normal","");
                  (*(((local_b0->mReader)._M_t.
                      super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                      .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                    super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
                  iVar8 = std::__cxx11::string::compare((char *)&local_d0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_d0._M_dataplus._M_p != paVar1) {
                    operator_delete(local_d0._M_dataplus._M_p,
                                    local_d0.field_2._M_allocated_capacity + 1);
                  }
                  this_01 = local_b0;
                  if (iVar8 == 0) {
                    ParseNode_Rendering_Normal(local_b0);
                  }
                  else {
                    local_d0._M_dataplus._M_p = (pointer)paVar1;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_d0,"TextureCoordinate","");
                    (*(((local_b0->mReader)._M_t.
                        super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                        .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                      super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
                    iVar8 = std::__cxx11::string::compare((char *)&local_d0);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_d0._M_dataplus._M_p != paVar1) {
                      operator_delete(local_d0._M_dataplus._M_p,
                                      local_d0.field_2._M_allocated_capacity + 1);
                    }
                    this_01 = local_b0;
                    if (iVar8 == 0) {
                      ParseNode_Texturing_TextureCoordinate(local_b0);
                    }
                    else {
                      bVar6 = ParseHelper_CheckRead_X3DMetadataObject(local_b0);
                      if (!bVar6) {
                        local_d0._M_dataplus._M_p = (pointer)paVar1;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_d0,"IndexedTriangleSet","");
                        XML_CheckNode_SkipUnsupported(this_01,&local_d0);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_d0._M_dataplus._M_p != paVar1) {
                          operator_delete(local_d0._M_dataplus._M_p,
                                          local_d0.field_2._M_allocated_capacity + 1);
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          iVar8 = (*(((this_01->mReader)._M_t.
                      super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                      .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                    super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[3])();
        } while (iVar8 != 2);
        local_d0._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"IndexedTriangleSet","")
        ;
        (*(((this_01->mReader)._M_t.
            super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
            super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
            super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
          super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
        iVar8 = std::__cxx11::string::compare((char *)&local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != paVar1) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        this_01 = local_b0;
      } while (iVar8 != 0);
LAB_0070f561:
      ParseHelper_Node_Exit(this_01);
    }
    else {
      pCVar13 = this_01->NodeElement_Cur;
      p_Var9 = (_List_node_base *)operator_new(0x18);
      p_Var9[1]._M_next = (_List_node_base *)pNode;
      std::__detail::_List_node_base::_M_hook(p_Var9);
      psVar17 = &(pCVar13->Child).
                 super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                 ._M_impl._M_node._M_size;
      *psVar17 = *psVar17 + 1;
    }
    p_Var9 = (_List_node_base *)operator_new(0x18);
    p_Var9[1]._M_next = (_List_node_base *)pNode;
    std::__detail::_List_node_base::_M_hook(p_Var9);
    psVar17 = &(this_01->NodeElement_List).
               super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
               ._M_impl._M_node._M_size;
    *psVar17 = *psVar17 + 1;
  }
  else {
    XML_CheckNode_MustBeEmpty(this);
    if (local_70._M_string_length != 0) {
      Throw_DEF_And_USE(this);
    }
    bVar6 = FindNodeElement(this,&local_50,ENET_IndexedTriangleSet,&local_78);
    if (!bVar6) {
      Throw_USE_NotFound(this,&local_50);
    }
    pCVar13 = this->NodeElement_Cur;
    p_Var9 = (_List_node_base *)operator_new(0x18);
    p_Var9[1]._M_next = (_List_node_base *)local_78;
    std::__detail::_List_node_base::_M_hook(p_Var9);
    psVar17 = &(pCVar13->Child).
               super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
               ._M_impl._M_node._M_size;
    *psVar17 = *psVar17 + 1;
  }
  if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void X3DImporter::ParseNode_Rendering_IndexedTriangleSet()
{
    std::string use, def;
    bool ccw = true;
    bool colorPerVertex = true;
    std::vector<int32_t> index;
    bool normalPerVertex = true;
    bool solid = true;
    CX3DImporter_NodeElement* ne( nullptr );

	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECKUSEDEF_RET(def, use);
		MACRO_ATTRREAD_CHECK_RET("ccw", ccw, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("colorPerVertex", colorPerVertex, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_REF("index", index, XML_ReadNode_GetAttrVal_AsArrI32);
		MACRO_ATTRREAD_CHECK_RET("normalPerVertex", normalPerVertex, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("solid", solid, XML_ReadNode_GetAttrVal_AsBool);
	MACRO_ATTRREAD_LOOPEND;

	// if "USE" defined then find already defined element.
	if(!use.empty())
	{
		MACRO_USE_CHECKANDAPPLY(def, use, ENET_IndexedTriangleSet, ne);
	}
	else
	{
		// check data
		if(index.size() == 0) throw DeadlyImportError("IndexedTriangleSet must contain not empty \"index\" attribute.");

		// create and if needed - define new geometry object.
		ne = new CX3DImporter_NodeElement_IndexedSet(CX3DImporter_NodeElement::ENET_IndexedTriangleSet, NodeElement_Cur);
		if(!def.empty()) ne->ID = def;

		CX3DImporter_NodeElement_IndexedSet& ne_alias = *((CX3DImporter_NodeElement_IndexedSet*)ne);

		ne_alias.CCW = ccw;
		ne_alias.ColorPerVertex = colorPerVertex;
		ne_alias.NormalPerVertex = normalPerVertex;
		ne_alias.Solid = solid;

		ne_alias.CoordIndex.clear();
		int counter = 0;
		int32_t idx[3];
		for(std::vector<int32_t>::const_iterator idx_it = index.begin(); idx_it != index.end(); ++idx_it)
		{
			idx[counter++] = *idx_it;
			if (counter > 2)
			{
				counter = 0;
				if(ccw)
				{
					ne_alias.CoordIndex.push_back(idx[0]);
					ne_alias.CoordIndex.push_back(idx[1]);
					ne_alias.CoordIndex.push_back(idx[2]);
				}
				else
				{
					ne_alias.CoordIndex.push_back(idx[0]);
					ne_alias.CoordIndex.push_back(idx[2]);
					ne_alias.CoordIndex.push_back(idx[1]);
				}
				ne_alias.CoordIndex.push_back(-1);
			}
		}// for(std::list<int32_t>::const_iterator idx_it = index.begin(); idx_it != ne_alias.index.end(); idx_it++)

        // check for child nodes
        if(!mReader->isEmptyElement())
        {
			ParseHelper_Node_Enter(ne);
			MACRO_NODECHECK_LOOPBEGIN("IndexedTriangleSet");
				// check for X3DComposedGeometryNodes
				if(XML_CheckNode_NameEqual("Color")) { ParseNode_Rendering_Color(); continue; }
				if(XML_CheckNode_NameEqual("ColorRGBA")) { ParseNode_Rendering_ColorRGBA(); continue; }
				if(XML_CheckNode_NameEqual("Coordinate")) { ParseNode_Rendering_Coordinate(); continue; }
				if(XML_CheckNode_NameEqual("Normal")) { ParseNode_Rendering_Normal(); continue; }
				if(XML_CheckNode_NameEqual("TextureCoordinate")) { ParseNode_Texturing_TextureCoordinate(); continue; }
				// check for X3DMetadataObject
				if(!ParseHelper_CheckRead_X3DMetadataObject()) XML_CheckNode_SkipUnsupported("IndexedTriangleSet");

			MACRO_NODECHECK_LOOPEND("IndexedTriangleSet");
			ParseHelper_Node_Exit();
		}// if(!mReader->isEmptyElement())
		else
		{
			NodeElement_Cur->Child.push_back(ne);// add made object as child to current element
		}

		NodeElement_List.push_back(ne);// add element to node element list because its a new object in graph
	}// if(!use.empty()) else
}